

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,char *origdir,char *str)

{
  bool bVar1;
  _func_void_ptr_PHYSFS_uint64 *p_Var2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  char *__dest;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  PHYSFS_EnumerateCallbackResult PVar9;
  uint uVar10;
  uint uVar11;
  
  uVar6 = *(uint *)((long)data + 8);
  pvVar4 = *data;
  if (uVar6 == 0) {
    bVar1 = true;
    uVar10 = 0;
  }
  else {
    uVar8 = uVar6;
    uVar11 = 0;
    do {
      uVar7 = uVar8 >> 1;
      iVar3 = strcmp(*(char **)((long)pvVar4 + (ulong)(uVar7 + uVar11) * 8),str);
      bVar1 = iVar3 != 0;
      uVar10 = uVar6;
      if (iVar3 == 0) break;
      uVar10 = uVar11;
      if (iVar3 < 1) {
        uVar10 = uVar7 + uVar11 + 1;
        uVar7 = uVar8 + ~uVar7;
      }
      uVar8 = uVar7;
      uVar11 = uVar10;
    } while (uVar8 != 0);
  }
  PVar9 = PHYSFS_ENUM_OK;
  if (bVar1) {
    pvVar4 = (*__PHYSFS_AllocatorHooks.Realloc)(pvVar4,(ulong)(uVar6 + 2) << 3);
    p_Var2 = __PHYSFS_AllocatorHooks.Malloc;
    sVar5 = strlen(str);
    __dest = (char *)(*p_Var2)(sVar5 + 1);
    if (pvVar4 != (void *)0x0) {
      *(void **)data = pvVar4;
    }
    if (__dest == (char *)0x0 || pvVar4 == (void *)0x0) {
      if (__dest != (char *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(__dest);
      }
      *(undefined4 *)((long)data + 0xc) = 2;
      PVar9 = PHYSFS_ENUM_ERROR;
    }
    else {
      strcpy(__dest,str);
      uVar6 = *(int *)((long)data + 8) - uVar10;
      if (uVar6 != 0) {
        memmove((void *)(*data + (ulong)(uVar10 + 1) * 8),(void *)(*data + (ulong)uVar10 * 8),
                (ulong)uVar6 << 3);
      }
      *(char **)(*data + (ulong)uVar10 * 8) = __dest;
      *(int *)((long)data + 8) = *(int *)((long)data + 8) + 1;
    }
  }
  return PVar9;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,
                                        const char *origdir, const char *str)
{
    PHYSFS_uint32 pos;
    void *ptr;
    char *newstr;
    EnumStringListCallbackData *pecd = (EnumStringListCallbackData *) data;

    /*
     * See if file is in the list already, and if not, insert it in there
     *  alphabetically...
     */
    pos = pecd->size;
    if (locateInStringList(str, pecd->list, &pos))
        return PHYSFS_ENUM_OK;  /* already in the list, but keep going. */

    ptr = allocator.Realloc(pecd->list, (pecd->size + 2) * sizeof (char *));
    newstr = (char *) allocator.Malloc(strlen(str) + 1);
    if (ptr != NULL)
        pecd->list = (char **) ptr;

    if ((ptr == NULL) || (newstr == NULL))
    {
        if (newstr)
            allocator.Free(newstr);

        pecd->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;  /* better luck next time. */
    } /* if */

    strcpy(newstr, str);

    if (pos != pecd->size)
    {
        memmove(&pecd->list[pos+1], &pecd->list[pos],
                 sizeof (char *) * ((pecd->size) - pos));
    } /* if */

    pecd->list[pos] = newstr;
    pecd->size++;

    return PHYSFS_ENUM_OK;
}